

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qvariantanimation.cpp
# Opt level: O1

void QVariantAnimation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QVariant *pQVar1;
  PrivateShared *pPVar2;
  int iVar3;
  parameter_type other;
  QBindableInterface *pQVar4;
  long *plVar5;
  QVariantAnimationPrivate *pQVar6;
  long in_FS_OFFSET;
  uint uVar7;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (_id == 0 && _c == InvokeMetaMethod) {
    local_58._8_8_ = _a[1];
    local_58.shared = (PrivateShared *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,0,&local_58.shared);
  }
  switch(_c) {
  case ReadProperty:
switchD_003bcc1d_caseD_1:
    if (4 < (uint)_id) goto LAB_003bcd11;
    pQVar1 = (QVariant *)*_a;
    switch(_id) {
    case 0:
      pQVar6 = (QVariantAnimationPrivate *)(_o->d_ptr).d;
      uVar7 = 0;
      goto LAB_003bccf6;
    case 1:
      pQVar6 = (QVariantAnimationPrivate *)(_o->d_ptr).d;
      uVar7 = 0x3ff00000;
LAB_003bccf6:
      QVariantAnimationPrivate::valueAt((QVariant *)&local_58,pQVar6,(qreal)((ulong)uVar7 << 0x20));
LAB_003bccfe:
      ::QVariant::operator=(pQVar1,(QVariant *)&local_58);
      ::QVariant::~QVariant((QVariant *)&local_58);
      break;
    case 2:
      currentValue((QVariant *)&local_58,(QVariantAnimation *)_o);
      goto LAB_003bccfe;
    case 3:
      iVar3 = (*_o->_vptr_QObject[0xc])(_o);
      *(int *)&(pQVar1->d).data = iVar3;
      break;
    case 4:
      other = QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>
              ::value((QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>
                       *)&(_o->d_ptr).d[3].bindingStorage);
      QEasingCurve::QEasingCurve((QEasingCurve *)&local_58.shared,other);
      pPVar2 = (pQVar1->d).data.shared;
      (pQVar1->d).data.shared = local_58.shared;
      local_58.shared = pPVar2;
      QEasingCurve::~QEasingCurve((QEasingCurve *)&local_58.shared);
    }
LAB_003bcd11:
    if (_c == BindableProperty) break;
    if (_c != WriteProperty) goto switchD_003bcc1d_caseD_3;
switchD_003bcc1d_caseD_2:
    if (4 < (uint)_id) goto switchD_003bcd39_caseD_2;
    pQVar1 = (QVariant *)*_a;
    switch(_id) {
    case 0:
      pQVar6 = (QVariantAnimationPrivate *)(_o->d_ptr).d;
      uVar7 = 0;
      goto LAB_003bcd5d;
    case 1:
      pQVar6 = (QVariantAnimationPrivate *)(_o->d_ptr).d;
      uVar7 = 0x3ff00000;
LAB_003bcd5d:
      QVariantAnimationPrivate::setValueAt(pQVar6,(qreal)((ulong)uVar7 << 0x20),pQVar1);
      break;
    case 3:
      setDuration((QVariantAnimation *)_o,*(int *)&(pQVar1->d).data);
      break;
    case 4:
      setEasingCurve((QVariantAnimation *)_o,(QEasingCurve *)pQVar1);
    }
switchD_003bcd39_caseD_2:
    if (_c != BindableProperty) goto switchD_003bcc1d_caseD_3;
    break;
  case WriteProperty:
    goto switchD_003bcc1d_caseD_2;
  default:
    goto switchD_003bcc1d_caseD_3;
  case IndexOfMethod:
    if ((*_a[1] == valueChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_003bcc1d_caseD_3;
    }
    if (_c != BindableProperty) {
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_003bcc1d_caseD_3;
        goto switchD_003bcc1d_caseD_1;
      }
      goto switchD_003bcc1d_caseD_2;
    }
    break;
  case BindableProperty:
    break;
  }
  if (_id == 4) {
    plVar5 = (long *)*_a;
    *plVar5 = (long)&(_o->d_ptr).d[3].bindingStorage;
    pQVar4 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>,_void>
              ::iface;
  }
  else {
    if (_id != 3) goto switchD_003bcc1d_caseD_3;
    plVar5 = (long *)*_a;
    *plVar5 = (long)&(_o->d_ptr).d[3].bindingStorage.bindingStatus;
    pQVar4 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>,_void>
              ::iface;
  }
  plVar5[1] = (long)pQVar4;
switchD_003bcc1d_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QVariantAnimation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QVariantAnimation *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->valueChanged((*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QVariantAnimation::*)(const QVariant & )>(_a, &QVariantAnimation::valueChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QVariant*>(_v) = _t->startValue(); break;
        case 1: *reinterpret_cast<QVariant*>(_v) = _t->endValue(); break;
        case 2: *reinterpret_cast<QVariant*>(_v) = _t->currentValue(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->duration(); break;
        case 4: *reinterpret_cast<QEasingCurve*>(_v) = _t->easingCurve(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setStartValue(*reinterpret_cast<QVariant*>(_v)); break;
        case 1: _t->setEndValue(*reinterpret_cast<QVariant*>(_v)); break;
        case 3: _t->setDuration(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setEasingCurve(*reinterpret_cast<QEasingCurve*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDuration(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableEasingCurve(); break;
        default: break;
        }
    }
}